

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O3

int ht_set(lgx_ht_t *ht,lgx_ht_node_t *node)

{
  ulong uVar1;
  int iVar2;
  lgx_ht_node_t **pplVar3;
  lgx_ht_node_s *plVar4;
  lgx_ht_node_s **pplVar5;
  lgx_ht_node_t *next;
  lgx_ht_node_t *plVar6;
  
  uVar1 = (ulong)node->hash % (ulong)ht->size;
  plVar6 = ht->table[uVar1];
  if (plVar6 == (lgx_ht_node_t *)0x0) {
    pplVar3 = ht->table + uVar1;
    plVar4 = (lgx_ht_node_s *)0x0;
  }
  else {
    do {
      iVar2 = lgx_str_cmp(&node->k,&plVar6->k);
      if (iVar2 == 0) {
        return 1;
      }
      plVar6 = plVar6->next;
    } while (plVar6 != (lgx_ht_node_s *)0x0);
    pplVar3 = ht->table + uVar1;
    plVar4 = *pplVar3;
  }
  node->next = plVar4;
  *pplVar3 = node;
  ht->length = ht->length + 1;
  pplVar5 = &ht->tail->order;
  if (ht->tail == (lgx_ht_node_t *)0x0) {
    pplVar5 = &ht->head;
  }
  *pplVar5 = node;
  ht->tail = node;
  return 0;
}

Assistant:

static int ht_set(lgx_ht_t* ht, lgx_ht_node_t* node) {
    unsigned pos = node->hash % ht->size;

    // 插入位置是空的
    if (!ht->table[pos]) {
        node->next = NULL;
        ht->table[pos] = node;
    } else {
        lgx_ht_node_t* next = ht->table[pos];
        while (next) {
            if (lgx_str_cmp(&node->k, &next->k) == 0) {
                // 键已存在
                return 1;
            }
            next = next->next;
        }

        // 插入到链表头部
        node->next = ht->table[pos];
        ht->table[pos] = node;
    }

    ++ ht->length;

    if (!ht->tail) {
        ht->head = node;
        ht->tail = node;
    } else {
        ht->tail->order = node;
        ht->tail = node;
    }

    return 0;
}